

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O3

void __thiscall OpenGLFrameBuffer::DoSetGamma(OpenGLFrameBuffer *this)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  int iVar5;
  long lVar6;
  uint uVar7;
  double dVar8;
  uint uVar24;
  uint uVar25;
  undefined1 auVar16 [16];
  double __x;
  double __x_00;
  double __x_01;
  double dVar9;
  double dVar26;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  double dVar10;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar18 [16];
  double dVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar19 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar27;
  float fVar28;
  float fVar29;
  double __y;
  double dVar30;
  double __x_02;
  double __x_03;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar43;
  uint uVar44;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  WORD gammaTable [768];
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  WORD local_618 [256];
  undefined1 auStack_418 [512];
  undefined1 auStack_218 [520];
  
  if (((this->super_SDLGLFB).m_supportsGamma == true) &&
     ((vid_hwgamma.Value == 0 ||
      ((vid_hwgamma.Value == 2 &&
       (iVar5 = (*(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.
                  super_DObject._vptr_DObject[0x21])(this), (char)iVar5 != '\0')))))) {
    fVar28 = Gamma.Value;
    if (4.0 <= Gamma.Value) {
      fVar28 = 4.0;
    }
    if (fVar28 <= 0.1) {
      fVar28 = 0.1;
    }
    __y = (double)(1.0 / fVar28);
    dVar8 = exp2(7.994353436858858 - __y * 7.994353436858858);
    fVar29 = vid_brightness.Value;
    if (0.8 <= vid_brightness.Value) {
      fVar29 = 0.8;
    }
    if (fVar29 <= -0.8) {
      fVar29 = -0.8;
    }
    dVar30 = (double)(fVar29 * 128.0);
    fVar29 = vid_contrast.Value;
    if (3.0 <= vid_contrast.Value) {
      fVar29 = 3.0;
    }
    if (fVar29 <= 0.1) {
      fVar29 = 0.1;
    }
    auVar16 = pshuflw(ZEXT116(fVar28 == 1.0),ZEXT116(fVar28 == 1.0),0);
    uVar37 = 4;
    uVar43 = 5;
    uVar44 = 6;
    uVar45 = 7;
    uVar7 = 0;
    uVar24 = 1;
    uVar25 = 2;
    uVar27 = 3;
    lVar6 = 0;
    do {
      __x_02 = (double)((((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar7 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      __x_03 = (double)((((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar24 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      __x = (double)((((float)(uVar25 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar25 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      dVar26 = (double)((((float)(uVar27 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar27 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      uStack_6a4 = (undefined4)((ulong)__x >> 0x20);
      uStack_6a0 = SUB84(dVar26,0);
      uStack_69c = (undefined4)((ulong)dVar26 >> 0x20);
      __x_00 = (double)((((float)(uVar37 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar37 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      dVar26 = (double)((((float)(uVar43 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar43 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      uStack_6b4 = (undefined4)((ulong)__x_00 >> 0x20);
      uStack_6b0 = SUB84(dVar26,0);
      uStack_6ac = (undefined4)((ulong)dVar26 >> 0x20);
      __x_01 = (double)((((float)(uVar44 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar44 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      dVar26 = (double)((((float)(uVar45 >> 0x10 | 0x53000000) - 5.497642e+11) +
                         (float)(uVar45 & 0xffff | 0x4b000000) + -127.0) * fVar29 + 127.0);
      uStack_684 = (undefined4)((ulong)__x_01 >> 0x20);
      uStack_680 = SUB84(dVar26,0);
      uStack_67c = (undefined4)((ulong)dVar26 >> 0x20);
      dVar26 = __y;
      dVar9 = pow(__x_01,__y);
      auVar1._4_8_ = extraout_XMM0_Qb;
      auVar1._0_4_ = uStack_684;
      auVar17._0_8_ = auVar1._0_8_ << 0x20;
      auVar17._8_4_ = uStack_680;
      auVar17._12_4_ = uStack_67c;
      uStack_714 = (undefined4)((ulong)__y >> 0x20);
      uStack_710 = SUB84(__y,0);
      auVar2._4_8_ = dVar26;
      auVar2._0_4_ = uStack_714;
      auVar31._0_8_ = auVar2._0_8_ << 0x20;
      auVar31._8_4_ = uStack_710;
      auVar31._12_4_ = uStack_714;
      dVar15 = auVar31._8_8_;
      dVar26 = pow(auVar17._8_8_,dVar15);
      dVar10 = pow(__x_00,__y);
      auVar3._4_8_ = extraout_XMM0_Qb_00;
      auVar3._0_4_ = uStack_6b4;
      auVar18._0_8_ = auVar3._0_8_ << 0x20;
      auVar18._8_4_ = uStack_6b0;
      auVar18._12_4_ = uStack_6ac;
      dVar11 = pow(auVar18._8_8_,dVar15);
      dVar12 = pow(__x,__y);
      auVar4._4_8_ = extraout_XMM0_Qb_01;
      auVar4._0_4_ = uStack_6a4;
      auVar19._0_8_ = auVar4._0_8_ << 0x20;
      auVar19._8_4_ = uStack_6a0;
      auVar19._12_4_ = uStack_69c;
      dVar13 = pow(auVar19._8_8_,dVar15);
      dVar14 = pow(__x_02,__y);
      dVar15 = pow(__x_03,dVar15);
      auVar38._0_8_ = dVar9 * dVar8;
      auVar38._8_8_ = dVar26 * dVar8;
      auVar16._4_4_ = auVar16._0_4_;
      auVar16._8_4_ = auVar16._0_4_;
      auVar16._12_4_ = auVar16._0_4_;
      auVar20 = pshufhw(auVar16,auVar16,0x55);
      auVar21._0_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar21._4_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar21._8_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar21._12_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar22._8_4_ = uStack_680;
      auVar22._0_8_ = __x_01;
      auVar22._12_4_ = uStack_67c;
      auVar52._0_8_ = dVar10 * dVar8;
      auVar52._8_8_ = dVar11 * dVar8;
      auVar22 = ~auVar21 & auVar38 | auVar22 & auVar21;
      auVar32._4_4_ = auVar16._0_4_;
      auVar32._0_4_ = auVar16._0_4_;
      auVar32._8_4_ = auVar16._0_4_;
      auVar32._12_4_ = auVar16._0_4_;
      auVar20 = pshufhw(auVar32,auVar32,0x55);
      auVar33._0_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar33._4_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar33._8_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar33._12_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar34._8_4_ = uStack_6b0;
      auVar34._0_8_ = __x_00;
      auVar34._12_4_ = uStack_6ac;
      auVar34 = ~auVar33 & auVar52 | auVar34 & auVar33;
      auVar39._4_4_ = auVar16._0_4_;
      auVar39._0_4_ = auVar16._0_4_;
      auVar39._8_4_ = auVar16._0_4_;
      auVar39._12_4_ = auVar16._0_4_;
      auVar20 = pshufhw(auVar39,auVar39,0x55);
      auVar40._0_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar40._4_4_ = (auVar20._0_4_ << 0x1f) >> 0x1f;
      auVar40._8_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar40._12_4_ = (auVar20._8_4_ << 0x1f) >> 0x1f;
      auVar42._8_4_ = uStack_6a0;
      auVar42._0_8_ = __x;
      auVar42._12_4_ = uStack_69c;
      auVar20._8_4_ = SUB84(dVar13 * dVar8,0);
      auVar20._0_8_ = dVar12 * dVar8;
      auVar20._12_4_ = (int)((ulong)(dVar13 * dVar8) >> 0x20);
      auVar20 = ~auVar40 & auVar20 | auVar42 & auVar40;
      auVar46._4_4_ = auVar16._0_4_;
      auVar46._0_4_ = auVar16._0_4_;
      auVar46._8_4_ = auVar16._0_4_;
      auVar46._12_4_ = auVar16._0_4_;
      auVar47 = pshufhw(auVar46,auVar46,0x55);
      auVar48._0_4_ = (auVar47._0_4_ << 0x1f) >> 0x1f;
      auVar48._4_4_ = (auVar47._0_4_ << 0x1f) >> 0x1f;
      auVar48._8_4_ = (auVar47._8_4_ << 0x1f) >> 0x1f;
      auVar48._12_4_ = (auVar47._8_4_ << 0x1f) >> 0x1f;
      auVar50._8_8_ = __x_03;
      auVar50._0_8_ = __x_02;
      auVar47._8_4_ = SUB84(dVar15 * dVar8,0);
      auVar47._0_8_ = dVar14 * dVar8;
      auVar47._12_4_ = (int)((ulong)(dVar15 * dVar8) >> 0x20);
      auVar47 = ~auVar48 & auVar47 | auVar50 & auVar48;
      auVar41._0_8_ = (auVar20._0_8_ + dVar30) * 256.0;
      auVar41._8_8_ = (auVar20._8_8_ + dVar30) * 256.0;
      auVar49._0_8_ = (auVar47._0_8_ + dVar30) * 256.0;
      auVar49._8_8_ = (auVar47._8_8_ + dVar30) * 256.0;
      auVar47 = minpd(auVar49,_DAT_0074ff60);
      auVar20 = minpd(auVar41,_DAT_0074ff60);
      auVar42 = maxpd(auVar20,ZEXT816(0));
      auVar50 = maxpd(auVar47,ZEXT816(0));
      auVar23._0_8_ = (auVar22._0_8_ + dVar30) * 256.0;
      auVar23._8_8_ = (auVar22._8_8_ + dVar30) * 256.0;
      auVar35._0_8_ = (auVar34._0_8_ + dVar30) * 256.0;
      auVar35._8_8_ = (auVar34._8_8_ + dVar30) * 256.0;
      auVar47 = minpd(auVar35,_DAT_0074ff60);
      auVar20 = minpd(auVar23,_DAT_0074ff60);
      auVar47 = maxpd(auVar47,ZEXT816(0));
      auVar20 = maxpd(auVar20,ZEXT816(0));
      auVar51._0_4_ = (int)(short)(int)auVar50._0_8_;
      auVar51._4_4_ = (int)(short)(int)auVar50._8_8_;
      auVar51._8_4_ = (int)(short)(int)auVar42._0_8_;
      auVar51._12_4_ = (int)(short)(int)auVar42._8_8_;
      auVar36._0_4_ = (int)(short)(int)auVar47._0_8_;
      auVar36._4_4_ = (int)(short)(int)auVar47._8_8_;
      auVar36._8_4_ = (int)(short)(int)auVar20._0_8_;
      auVar36._12_4_ = (int)(short)(int)auVar20._8_8_;
      auVar20 = packssdw(auVar51,auVar36);
      *(undefined1 (*) [16])(auStack_218 + lVar6 * 2) = auVar20;
      *(undefined1 (*) [16])(auStack_418 + lVar6 * 2) = auVar20;
      *(undefined1 (*) [16])(local_618 + lVar6) = auVar20;
      lVar6 = lVar6 + 8;
      uVar7 = uVar7 + 8;
      uVar24 = uVar24 + 8;
      uVar25 = uVar25 + 8;
      uVar27 = uVar27 + 8;
      uVar37 = uVar37 + 8;
      uVar43 = uVar43 + 8;
      uVar44 = uVar44 + 8;
      uVar45 = uVar45 + 8;
    } while (lVar6 != 0x100);
    SDLGLFB::SetGammaTable(&this->super_SDLGLFB,local_618);
    this->HWGammaActive = true;
    return;
  }
  if (this->HWGammaActive == true) {
    SDLGLFB::ResetGammaTable(&this->super_SDLGLFB);
    this->HWGammaActive = false;
  }
  return;
}

Assistant:

void OpenGLFrameBuffer::DoSetGamma()
{
	bool useHWGamma = m_supportsGamma && ((vid_hwgamma == 0) || (vid_hwgamma == 2 && IsFullscreen()));
	if (useHWGamma)
	{
		WORD gammaTable[768];

		// This formula is taken from Doomsday
		float gamma = clamp<float>(Gamma, 0.1f, 4.f);
		float contrast = clamp<float>(vid_contrast, 0.1f, 3.f);
		float bright = clamp<float>(vid_brightness, -0.8f, 0.8f);

		double invgamma = 1 / gamma;
		double norm = pow(255., invgamma - 1);

		for (int i = 0; i < 256; i++)
		{
			double val = i * contrast - (contrast - 1) * 127;
			if(gamma != 1) val = pow(val, invgamma) / norm;
			val += bright * 128;

			gammaTable[i] = gammaTable[i + 256] = gammaTable[i + 512] = (WORD)clamp<double>(val*256, 0, 0xffff);
		}
		SetGammaTable(gammaTable);

		HWGammaActive = true;
	}
	else if (HWGammaActive)
	{
		ResetGammaTable();
		HWGammaActive = false;
	}
}